

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::SearchFreeAndLargeLists(PageHeap *this,Length n)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Span *in_RAX;
  Span *pSVar5;
  ulong uVar6;
  long lVar7;
  
  bVar2 = n >= 0x81;
  if (n < 0x81) {
    in_RAX = (Span *)(n * 0x20);
    lVar7 = n * 0x60;
    uVar6 = n;
    do {
      lVar1 = (long)(this->pagemap_cache_).array_ + lVar7 + -0x10;
      pSVar5 = *(Span **)(&DAT_00180028 + lVar1);
      if ((Span *)(&DAT_00180018 + lVar1) == *(Span **)(&DAT_00180028 + lVar1)) {
        lVar1 = (long)(this->pagemap_cache_).array_ + lVar7 + -0x10;
        bVar3 = true;
        if (((&DAT_00180048 + lVar1 != *(undefined **)(&DAT_00180058 + lVar1)) &&
            (bVar4 = EnsureLimit(this,n,true), bVar4)) &&
           (&DAT_00180048 + lVar1 != *(undefined **)((long)this->free_ + lVar7 + -0x20))) {
          pSVar5 = *(Span **)((long)this->free_ + lVar7 + -0x20);
          goto LAB_00114e8b;
        }
      }
      else {
LAB_00114e8b:
        in_RAX = pSVar5;
        Carve(this,in_RAX,n);
        bVar3 = false;
      }
      if (!bVar3) break;
      bVar2 = 0x7f < uVar6;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x60;
    } while (uVar6 != 0x81);
  }
  if (!bVar2) {
    return in_RAX;
  }
  pSVar5 = AllocLarge(this,n);
  return pSVar5;
}

Assistant:

Span* PageHeap::SearchFreeAndLargeLists(Length n) {
  ASSERT(lock_.IsHeld());
  ASSERT(Check());
  ASSERT(n > 0);

  // Find first size >= n that has a non-empty list
  for (Length s = n; s <= kMaxPages; s++) {
    Span* ll = &free_[s - 1].normal;
    // If we're lucky, ll is non-empty, meaning it has a suitable span.
    if (!DLL_IsEmpty(ll)) {
      ASSERT(ll->next->location == Span::ON_NORMAL_FREELIST);
      return Carve(ll->next, n);
    }
    // Alternatively, maybe there's a usable returned span.
    ll = &free_[s - 1].returned;
    if (!DLL_IsEmpty(ll)) {
      // We did not call EnsureLimit before, to avoid releasing the span
      // that will be taken immediately back.
      // Calling EnsureLimit here is not very expensive, as it fails only if
      // there is no more normal spans (and it fails efficiently)
      // or SystemRelease does not work (there is probably no returned spans).
      if (EnsureLimit(n)) {
        // ll may have became empty due to coalescing
        if (!DLL_IsEmpty(ll)) {
          ASSERT(ll->next->location == Span::ON_RETURNED_FREELIST);
          return Carve(ll->next, n);
        }
      }
    }
  }
  // No luck in free lists, our last chance is in a larger class.
  return AllocLarge(n);  // May be nullptr
}